

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

int speex_resampler_magic
              (SpeexResamplerState *st,uint channel_index,spx_word16_t **out,uint out_len)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  spx_word16_t *in_RDX;
  uint in_ESI;
  long in_RDI;
  SpeexResamplerState *unaff_retaddr;
  uint i;
  int N;
  spx_word16_t *mem;
  uint tmp_in_len;
  undefined4 local_30;
  int iVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar3 = *(int *)(*(long *)(in_RDI + 0x50) + (ulong)in_ESI * 4);
  lVar2 = *(long *)(in_RDI + 0x58) + (ulong)(in_ESI * *(int *)(in_RDI + 0x1c)) * 4;
  iVar1 = *(int *)(in_RDI + 0x18);
  speex_resampler_process_native
            (unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),
             (uint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
             (uint *)CONCAT44(in_ECX,iVar3));
  *(int *)(*(long *)(in_RDI + 0x50) + (ulong)in_ESI * 4) =
       *(int *)(*(long *)(in_RDI + 0x50) + (ulong)in_ESI * 4) - iVar3;
  if (*(int *)(*(long *)(in_RDI + 0x50) + (ulong)in_ESI * 4) != 0) {
    for (local_30 = 0; local_30 < *(uint *)(*(long *)(in_RDI + 0x50) + (ulong)in_ESI * 4);
        local_30 = local_30 + 1) {
      *(undefined4 *)(lVar2 + (ulong)(iVar1 + -1 + local_30) * 4) =
           *(undefined4 *)(lVar2 + (ulong)(iVar1 + -1 + local_30 + iVar3) * 4);
    }
  }
  *(ulong *)in_RDX = *(long *)in_RDX + (ulong)(uint)(in_ECX * *(int *)(in_RDI + 0x7c)) * 4;
  return in_ECX;
}

Assistant:

static int speex_resampler_magic(SpeexResamplerState *st, spx_uint32_t channel_index, spx_word16_t **out, spx_uint32_t out_len) {
   spx_uint32_t tmp_in_len = st->magic_samples[channel_index];
   spx_word16_t *mem = st->mem + channel_index * st->mem_alloc_size;
   const int N = st->filt_len;

   speex_resampler_process_native(st, channel_index, &tmp_in_len, *out, &out_len);

   st->magic_samples[channel_index] -= tmp_in_len;

   /* If we couldn't process all "magic" input samples, save the rest for next time */
   if (st->magic_samples[channel_index])
   {
      spx_uint32_t i;
      for (i=0;i<st->magic_samples[channel_index];i++)
         mem[N-1+i]=mem[N-1+i+tmp_in_len];
   }
   *out += out_len*st->out_stride;
   return out_len;
}